

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O1

void __thiscall
Centaurus::Grammar<wchar_t>::print_dfa
          (Grammar<wchar_t> *this,wostream *os,ATNPath *path,bool optimize_flag)

{
  ATNNode<wchar_t> *pAVar1;
  SimpleException *this_00;
  DFA<wchar_t> dfa;
  undefined1 local_40 [16];
  _func_int *local_30 [2];
  
  pAVar1 = resolve(this,path);
  if (pAVar1->m_type == RegularTerminal) {
    DFA<wchar_t>::DFA((DFA<wchar_t> *)local_40,&pAVar1->m_nfa,optimize_flag);
    DFA<wchar_t>::print((DFA<wchar_t> *)local_40,os,
                        &(path->
                         super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         ).
                         super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].first.m_id);
    local_40._0_8_ = &PTR__NFABase_001a1170;
    std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>::
    ~vector((vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_> *)
            (local_40 + 8));
    return;
  }
  this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
  local_40._0_8_ = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"The specified node is not an NFA.","");
  SimpleException::SimpleException(this_00,(string *)local_40);
  __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
}

Assistant:

virtual void print_dfa(std::wostream& os, const ATNPath& path, bool optimize_flag) const override
    {
        const ATNNode<TCHAR>& node = resolve(path);

        if (node.type() != ATNNodeType::RegularTerminal)
        {
            throw SimpleException("The specified node is not an NFA.");
        }
        else
        {
            const NFA<TCHAR>& nfa = node.get_nfa();

            DFA<TCHAR> dfa(nfa, optimize_flag);

            dfa.print(os, path.leaf_id().str());
        }
    }